

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation_state.cpp
# Opt level: O0

void __thiscall
spvtools::val::ValidationState_t::set_addressing_model(ValidationState_t *this,AddressingModel am)

{
  AddressingModel am_local;
  ValidationState_t *this_local;
  
  this->addressing_model_ = am;
  if (am == AddressingModelPhysical32) {
    this->pointer_size_and_alignment_ = 4;
  }
  else {
    this->pointer_size_and_alignment_ = 8;
  }
  return;
}

Assistant:

void ValidationState_t::set_addressing_model(spv::AddressingModel am) {
  addressing_model_ = am;
  switch (am) {
    case spv::AddressingModel::Physical32:
      pointer_size_and_alignment_ = 4;
      break;
    default:
    // fall through
    case spv::AddressingModel::Physical64:
    case spv::AddressingModel::PhysicalStorageBuffer64:
      pointer_size_and_alignment_ = 8;
      break;
  }
}